

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.hpp
# Opt level: O3

ssize_t __thiscall
just::process::impl::input_file::read_abi_cxx11_
          (input_file *this,int __fd,void *__buf,size_t __nbytes)

{
  ssize_t sVar1;
  undefined4 in_register_00000034;
  int *piVar2;
  ostringstream s;
  char buff [1024];
  ostringstream local_5a0 [112];
  ios_base local_530 [264];
  undefined1 local_428 [1032];
  
  piVar2 = (int *)CONCAT44(in_register_00000034,__fd);
  std::__cxx11::ostringstream::ostringstream(local_5a0);
  while ((char)piVar2[1] == '\0') {
    sVar1 = ::read(*piVar2,local_428,0x400);
    *(bool *)(piVar2 + 1) = sVar1 == 0;
    std::ostream::write((char *)local_5a0,(long)local_428);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_5a0);
  std::ios_base::~ios_base(local_530);
  return (ssize_t)this;
}

Assistant:

std::string read()
        {
          std::ostringstream s;
          static const int buffsize = 1024;
          char buff[buffsize];
          while (!eof())
          {
            s.write(buff, read(buff, buffsize));
          }
          return s.str();
        }